

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshSceneNode.cpp
# Opt level: O1

void __thiscall irr::scene::CMeshSceneNode::copyMaterials(CMeshSceneNode *this)

{
  int iVar1;
  uint uVar2;
  undefined8 *puVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  SMaterial mat;
  pointer pSStack_f0;
  undefined1 local_e8 [16];
  pointer local_d8;
  undefined8 auStack_d0 [20];
  undefined4 extraout_var;
  
  local_e8._0_8_ =
       (this->Materials).m_data.
       super__Vector_base<irr::video::SMaterial,_std::allocator<irr::video::SMaterial>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_e8._8_8_ =
       (this->Materials).m_data.
       super__Vector_base<irr::video::SMaterial,_std::allocator<irr::video::SMaterial>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_d8 = (this->Materials).m_data.
             super__Vector_base<irr::video::SMaterial,_std::allocator<irr::video::SMaterial>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->Materials).m_data.
  super__Vector_base<irr::video::SMaterial,_std::allocator<irr::video::SMaterial>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Materials).m_data.
  super__Vector_base<irr::video::SMaterial,_std::allocator<irr::video::SMaterial>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Materials).m_data.
  super__Vector_base<irr::video::SMaterial,_std::allocator<irr::video::SMaterial>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSStack_f0 = (pointer)0x1ac611;
  ::std::vector<irr::video::SMaterial,_std::allocator<irr::video::SMaterial>_>::~vector
            ((vector<irr::video::SMaterial,_std::allocator<irr::video::SMaterial>_> *)local_e8);
  (this->Materials).is_sorted = true;
  if (this->Mesh != (IMesh *)0x0) {
    pSStack_f0 = (pointer)0x1ac62d;
    video::SMaterial::SMaterial((SMaterial *)local_e8);
    pSStack_f0 = (pointer)0x1ac639;
    iVar1 = (**this->Mesh->_vptr_IMesh)();
    if (iVar1 != 0) {
      uVar7 = 0;
      do {
        pSStack_f0 = (pointer)0x1ac663;
        iVar1 = (*this->Mesh->_vptr_IMesh[1])(this->Mesh,uVar7);
        puVar3 = (undefined8 *)CONCAT44(extraout_var,iVar1);
        if (puVar3 != (undefined8 *)0x0) {
          pSStack_f0 = (pointer)0x1ac670;
          lVar4 = (**(code **)*puVar3)(puVar3);
          lVar5 = 0;
          do {
            pSStack_f0 = (pointer)0x1ac683;
            video::SMaterialLayer::operator=
                      ((SMaterialLayer *)(local_e8 + lVar5),(SMaterialLayer *)(lVar5 + lVar4));
            lVar5 = lVar5 + 0x20;
          } while (lVar5 != 0x80);
          auStack_d0[0x13]._0_2_ = *(undefined2 *)(lVar4 + 0xb0);
          auStack_d0[0xd] = *(undefined8 *)(lVar4 + 0x80);
          auStack_d0[0xe] = *(undefined8 *)(lVar4 + 0x88);
          auStack_d0[0xf] = *(undefined8 *)(lVar4 + 0x90);
          auStack_d0[0x10] = *(undefined8 *)(lVar4 + 0x98);
          auStack_d0[0x11] = *(undefined8 *)(lVar4 + 0xa0);
          auStack_d0[0x12] = *(undefined8 *)(lVar4 + 0xa8);
        }
        pSStack_f0 = (pointer)0x1ac6cb;
        ::std::vector<irr::video::SMaterial,_std::allocator<irr::video::SMaterial>_>::push_back
                  (&(this->Materials).m_data,(value_type *)local_e8);
        (this->Materials).is_sorted = false;
        uVar6 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar6;
        pSStack_f0 = (pointer)0x1ac6e1;
        uVar2 = (**this->Mesh->_vptr_IMesh)();
      } while (uVar6 < uVar2);
    }
    lVar4 = 0x80;
    do {
      if (*(void **)((long)&pSStack_f0 + lVar4) != (void *)0x0) {
        pSStack_f0 = (pointer)0x1ac703;
        operator_delete(*(void **)((long)&pSStack_f0 + lVar4),0x40);
      }
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != 0);
  }
  return;
}

Assistant:

void CMeshSceneNode::copyMaterials()
{
	Materials.clear();

	if (Mesh) {
		video::SMaterial mat;

		for (u32 i = 0; i < Mesh->getMeshBufferCount(); ++i) {
			IMeshBuffer *mb = Mesh->getMeshBuffer(i);
			if (mb)
				mat = mb->getMaterial();

			Materials.push_back(mat);
		}
	}
}